

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void Commands::Uptime(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *arguments,Command_Source *from)

{
  double time;
  int iVar1;
  undefined4 extraout_var;
  char *this;
  double current_time;
  string buffer;
  string local_68;
  string local_48 [32];
  string local_28 [32];
  
  this = "Server started ";
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"Server started ",(allocator<char> *)&local_68);
  iVar1 = (*from->_vptr_Command_Source[4])(from);
  time = *(double *)(*(long *)(CONCAT44(extraout_var,iVar1) + 0x80) + 0x98);
  current_time = Timer::GetTime();
  util::timeago_abi_cxx11_(&local_68,(util *)this,time,current_time);
  std::__cxx11::string::append(local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string(local_28,local_48);
  (*from->_vptr_Command_Source[5])(from,local_28);
  std::__cxx11::string::~string(local_28);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Uptime(const std::vector<std::string>& arguments, Command_Source* from)
{
	(void)arguments;

	std::string buffer = "Server started ";
	buffer += util::timeago(from->SourceWorld()->server->start, Timer::GetTime());
	from->ServerMsg(buffer);
}